

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellLinkHeader.cpp
# Opt level: O0

void __thiscall
ShellLinkHeader::fillShellLinkHeader
          (ShellLinkHeader *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *header)

{
  iterator __first;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var1;
  back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> bVar2;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var3;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_20;
  iterator it;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *header_local;
  ShellLinkHeader *this_local;
  
  it._M_current = (uchar *)header;
  __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(header);
  local_20._M_current = __first._M_current;
  _Var1 = __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+(&local_20,4);
  bVar2 = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    (&this->HeaderSize);
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__first._M_current,_Var1,bVar2);
  _Var1 = __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+(&local_20,4);
  local_20 = _Var1;
  _Var3 = __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+(&local_20,0x10);
  bVar2 = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    (&this->LinkCLSID);
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (_Var1,_Var3,bVar2);
  _Var1 = __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+(&local_20,0x10);
  local_20 = _Var1;
  _Var3 = __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+(&local_20,4);
  bVar2 = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    (&this->LinkFlags);
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (_Var1,_Var3,bVar2);
  _Var1 = __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+(&local_20,4);
  local_20 = _Var1;
  _Var3 = __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+(&local_20,4);
  bVar2 = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    (&this->FileAttributes);
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (_Var1,_Var3,bVar2);
  _Var1 = __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+(&local_20,4);
  local_20 = _Var1;
  _Var3 = __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+(&local_20,8);
  bVar2 = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    (&this->CreationTime);
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (_Var1,_Var3,bVar2);
  _Var1 = __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+(&local_20,8);
  local_20 = _Var1;
  _Var3 = __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+(&local_20,8);
  bVar2 = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    (&this->AccessTime);
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (_Var1,_Var3,bVar2);
  _Var1 = __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+(&local_20,8);
  local_20 = _Var1;
  _Var3 = __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+(&local_20,8);
  bVar2 = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    (&this->WriteTime);
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (_Var1,_Var3,bVar2);
  _Var1 = __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+(&local_20,8);
  local_20 = _Var1;
  _Var3 = __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+(&local_20,4);
  bVar2 = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    (&this->FileSize);
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (_Var1,_Var3,bVar2);
  _Var1 = __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+(&local_20,4);
  local_20 = _Var1;
  _Var3 = __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+(&local_20,4);
  bVar2 = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    (&this->IconIndex);
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (_Var1,_Var3,bVar2);
  _Var1 = __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+(&local_20,4);
  local_20 = _Var1;
  _Var3 = __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+(&local_20,4);
  bVar2 = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    (&this->ShowCommand);
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (_Var1,_Var3,bVar2);
  _Var1 = __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+(&local_20,4);
  local_20 = _Var1;
  _Var3 = __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+(&local_20,2);
  bVar2 = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>(&this->HotKey);
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (_Var1,_Var3,bVar2);
  _Var1 = __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+(&local_20,2);
  local_20 = _Var1;
  _Var3 = __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+(&local_20,2);
  bVar2 = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    (&this->Reserved1);
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (_Var1,_Var3,bVar2);
  _Var1 = __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+(&local_20,2);
  local_20 = _Var1;
  _Var3 = __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+(&local_20,4);
  bVar2 = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    (&this->Reserved2);
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (_Var1,_Var3,bVar2);
  _Var1 = __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+(&local_20,4);
  local_20 = _Var1;
  _Var3 = __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+(&local_20,4);
  bVar2 = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    (&this->Reserved3);
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (_Var1,_Var3,bVar2);
  reverseAllFields(this);
  return;
}

Assistant:

void ShellLinkHeader::fillShellLinkHeader(std::vector<unsigned char> header) {
        /* Fill all field */
        auto it = header.begin();

        std::copy(it, it + 4, std::back_inserter(HeaderSize));              // 4 byte
        it = it + 4;
        std::copy(it, it + 16, std::back_inserter(LinkCLSID));              // 16 byte
        it = it + 16;
        std::copy(it, it + 4, std::back_inserter(LinkFlags));               // 4 byte
        it = it + 4;
        std::copy(it, it + 4, std::back_inserter(FileAttributes));          // 4 byte
        it = it + 4;
        std::copy(it, it + 8, std::back_inserter(CreationTime));            // 8 byte
        it = it + 8;
        std::copy(it, it + 8, std::back_inserter(AccessTime));              // 8 byte
        it = it + 8;
        std::copy(it, it + 8, std::back_inserter(WriteTime));               // 8 byte
        it = it + 8;
        std::copy(it, it + 4, std::back_inserter(FileSize));                // 4 byte
        it = it + 4;
        std::copy(it, it + 4, std::back_inserter(IconIndex));               // 4 byte
        it = it + 4;
        std::copy(it, it + 4, std::back_inserter(ShowCommand));             // 4 byte
        it = it + 4;
        std::copy(it, it + 2, std::back_inserter(HotKey));                  // 2 byte
        it = it + 2;
        std::copy(it, it + 2, std::back_inserter(Reserved1));               // 2 byte
        it = it + 2;
        std::copy(it, it + 4, std::back_inserter(Reserved2));               // 4 byte
        it = it + 4;
        std::copy(it, it + 4, std::back_inserter(Reserved3));               // 4 byte

        /* Reverse All field (read left -> rigth) */
        ShellLinkHeader::reverseAllFields();
    }